

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::StructType::~StructType(StructType *this)

{
  pointer pcVar1;
  
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__StructType_001c3c08;
  std::vector<wabt::Field,_std::allocator<wabt::Field>_>::~vector(&this->fields);
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__TypeEntry_001c33d8;
  pcVar1 = (this->super_TypeEntry).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_TypeEntry).name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

static bool classof(const TypeEntry* entry) {
    return entry->kind() == TypeEntryKind::Struct;
  }